

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-ctx.cpp
# Opt level: O0

bool gpt2_model_load(string *fname,gpt2_model *model,gpt_vocab *vocab)

{
  mapped_type pgVar1;
  void *__src;
  FILE *pFVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  mapped_type *this;
  long lVar9;
  long lVar10;
  mapped_type *ppgVar11;
  ggml_tensor *pgVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  size_t __n;
  uint *in_RSI;
  string *in_RDI;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  size_t bpe;
  mapped_type tensor;
  string name;
  int i_2;
  int32_t ne [2];
  int32_t nelements;
  int32_t ttype;
  int32_t length;
  int32_t n_dims;
  bool has_lm_head;
  size_t total_size;
  size_t memory_size;
  int n_elements;
  int n_mem;
  int n_ctx_2;
  int n_layer_2;
  int n_embd_2;
  gpt2_hparams *hparams_3;
  value_type *layer;
  int i_1;
  int n_vocab_2;
  int n_ctx_1;
  int n_layer_1;
  int n_embd_1;
  gpt2_hparams *hparams_2;
  ggml_init_params params;
  int n_vocab_1;
  int n_ctx;
  int n_layer;
  int n_embd;
  gpt2_hparams *hparams_1;
  size_t ctx_size;
  ggml_context **ctx;
  ggml_type wtype;
  uint32_t len;
  int i;
  vector<char,_std::allocator<char>_> buf;
  string word;
  int32_t n_vocab;
  int32_t qntvr;
  gpt2_hparams *hparams;
  uint32_t magic;
  ifstream fin;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  allocator_type *in_stack_fffffffffffff270;
  undefined7 in_stack_fffffffffffff278;
  undefined1 in_stack_fffffffffffff27f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff280;
  allocator<char> *in_stack_fffffffffffff290;
  undefined7 in_stack_fffffffffffff298;
  undefined1 in_stack_fffffffffffff29f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2a0;
  undefined8 in_stack_fffffffffffff2a8;
  _Self local_8e8;
  _Self local_8e0;
  allocator<char> local_8d1;
  string local_8d0 [32];
  int local_8b0;
  int local_8ac [4];
  undefined1 local_89c [4];
  int local_898;
  byte local_891;
  allocator_type *local_890;
  long local_888;
  int local_87c;
  uint local_878;
  uint local_874;
  uint local_870;
  uint local_86c;
  uint *local_868;
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  reference local_3e0;
  int local_3d8;
  allocator<char> local_3d1;
  string local_3d0 [39];
  allocator<char> local_3a9;
  string local_3a8 [39];
  allocator<char> local_381;
  string local_380 [39];
  allocator<char> local_359;
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [32];
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint *local_300;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *local_2f8;
  undefined8 uStack_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8;
  uint7 uStack_2c7;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint *local_2b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  *local_2a8;
  uint *local_2a0;
  int local_298;
  undefined1 local_294 [4];
  int local_290;
  allocator<char> local_289 [25];
  string local_270 [32];
  uint local_250;
  uint local_24c;
  uint *local_248;
  int local_23c;
  int local_238;
  long local_228 [66];
  uint *local_18;
  string *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar6 = std::__cxx11::string::c_str();
  printf("%s: loading model from \'%s\'\n","gpt2_model_load",uVar6);
  std::ifstream::ifstream(local_228,local_10,_S_bin);
  bVar3 = std::ios::operator!((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18)));
  pFVar2 = _stderr;
  if ((bVar3 & 1) == 0) {
    std::istream::read((char *)local_228,(long)&local_23c);
    pFVar2 = _stderr;
    if (local_23c == 0x67676d6c) {
      local_248 = local_18;
      std::istream::read((char *)local_228,(long)local_18);
      std::istream::read((char *)local_228,(long)(local_248 + 1));
      std::istream::read((char *)local_228,(long)(local_248 + 2));
      std::istream::read((char *)local_228,(long)(local_248 + 3));
      std::istream::read((char *)local_228,(long)(local_248 + 4));
      std::istream::read((char *)local_228,(long)(local_248 + 5));
      local_24c = (int)local_248[5] / 1000;
      printf("%s: n_vocab = %d\n","gpt2_model_load",(ulong)*local_248);
      printf("%s: n_ctx   = %d\n","gpt2_model_load",(ulong)local_248[1]);
      printf("%s: n_embd  = %d\n","gpt2_model_load",(ulong)local_248[2]);
      printf("%s: n_head  = %d\n","gpt2_model_load",(ulong)local_248[3]);
      printf("%s: n_layer = %d\n","gpt2_model_load",(ulong)local_248[4]);
      printf("%s: ftype   = %d\n","gpt2_model_load",(ulong)local_248[5]);
      printf("%s: qntvr   = %d\n","gpt2_model_load",(ulong)local_24c);
      local_248[5] = (int)local_248[5] % 1000;
      local_250 = 0;
      std::istream::read((char *)local_228,(long)&local_250);
      pFVar2 = _stderr;
      if (local_250 == *local_18) {
        std::__cxx11::string::string(local_270);
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff280,
                   CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                   in_stack_fffffffffffff270);
        std::allocator<char>::~allocator(local_289);
        for (local_290 = 0; local_290 < (int)local_250; local_290 = local_290 + 1) {
          std::istream::read((char *)local_228,(long)local_294);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff280,
                     CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278));
          pcVar7 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x1106e5);
          std::istream::read((char *)local_228,(long)pcVar7);
          pcVar7 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x11070d);
          std::__cxx11::string::assign((char *)local_270,(ulong)pcVar7);
          iVar5 = local_290;
          pmVar8 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                 *)in_stack_fffffffffffff2a0,
                                (key_type *)
                                CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
          *pmVar8 = iVar5;
          this = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff2a0,
                              (key_type *)
                              CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
          std::__cxx11::string::operator=((string *)this,local_270);
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff270);
        std::__cxx11::string::~string(local_270);
        local_298 = ggml_ftype_to_ggml_type(local_18[5]);
        pFVar2 = _stderr;
        if (local_298 == 0x27) {
          uVar6 = std::__cxx11::string::c_str();
          fprintf(pFVar2,"%s: invalid model file \'%s\' (bad ftype value %d)\n","gpt2_model_load",
                  uVar6,(ulong)local_18[5]);
          local_1 = 0;
          local_238 = 1;
        }
        else {
          local_2a0 = local_18 + 0x1c;
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)0x0;
          local_2b0 = local_18;
          local_2b4 = local_18[2];
          local_2b8 = local_18[4];
          local_2bc = local_18[1];
          local_2c0 = *local_18;
          lVar9 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9);
          lVar9 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9);
          lVar9 = ggml_row_size(local_298,(long)(int)(local_2c0 * local_2b4));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9);
          lVar9 = ggml_row_size(0,(long)(int)(local_2bc * local_2b4));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9);
          lVar9 = ggml_row_size(local_298,(long)(int)(local_2c0 * local_2b4));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(local_298,(long)(int)(local_2b4 * local_2b4 * 3));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)(local_2b4 * 3));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(local_298,local_2b4 * local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(local_298,(long)(int)(local_2b4 * local_2b4 * 4));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)(local_2b4 << 2));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(local_298,(long)(int)(local_2b4 * local_2b4 * 4));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          lVar9 = (long)(int)local_2b8;
          lVar10 = ggml_row_size(0,(long)(int)(local_2b4 << 2));
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + lVar9 * lVar10);
          iVar5 = local_2bc * local_2b8;
          lVar9 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + iVar5 * lVar9);
          iVar5 = local_2bc * local_2b8;
          lVar9 = ggml_row_size(0,(long)(int)local_2b4);
          local_2a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       *)((long)local_2a8 + iVar5 * lVar9 + (long)(int)(local_2b8 * 0x1800 + 0xc00))
          ;
          printf("%s: ggml tensor size = %d bytes\n","gpt2_model_load",0x150);
          auVar16._8_4_ = (int)((ulong)local_2a8 >> 0x20);
          auVar16._0_8_ = local_2a8;
          auVar16._12_4_ = 0x45300000;
          printf("%s: ggml ctx size = %6.2f MB\n",
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2a8) - 4503599627370496.0)) *
                 9.5367431640625e-07,"gpt2_model_load");
          local_2d8 = local_2a8;
          uStack_2d0 = 0;
          local_2c8 = 0;
          __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)uStack_2c7 << 8);
          local_2f8 = local_2a8;
          uStack_2f0 = 0;
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          this_00 = local_2a8;
          local_2e8 = __lhs_00;
          uVar6 = ggml_init();
          *(undefined8 *)(local_18 + 0x1c) = uVar6;
          if (*(long *)(local_18 + 0x1c) == 0) {
            fprintf(_stderr,"%s: ggml_init() failed\n","gpt2_model_load");
            local_1 = 0;
            local_238 = 1;
          }
          else {
            local_300 = local_18;
            local_304 = local_18[2];
            local_308 = local_18[4];
            local_30c = local_18[1];
            local_310 = *local_18;
            std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::resize
                      ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)in_stack_fffffffffffff280,
                       CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278));
            uVar6 = ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
            *(undefined8 *)(local_18 + 8) = uVar6;
            uVar6 = ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
            *(undefined8 *)(local_18 + 10) = uVar6;
            uVar6 = ggml_new_tensor_2d(*(undefined8 *)local_2a0,local_298,(long)(int)local_304,
                                       (long)(int)local_310);
            *(undefined8 *)(local_18 + 0xc) = uVar6;
            uVar6 = ggml_new_tensor_2d(*(undefined8 *)local_2a0,0,(long)(int)local_304,
                                       (long)(int)local_30c);
            *(undefined8 *)(local_18 + 0xe) = uVar6;
            uVar6 = ggml_new_tensor_2d(*(undefined8 *)local_2a0,local_298,(long)(int)local_304,
                                       (long)(int)local_310);
            *(undefined8 *)(local_18 + 0x10) = uVar6;
            pgVar1 = *(mapped_type *)(local_18 + 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff2a0,
                       (char *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298),
                       in_stack_fffffffffffff290);
            ppgVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_fffffffffffff2a0,
                                    (key_type *)
                                    CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
            *ppgVar11 = pgVar1;
            std::__cxx11::string::~string(local_330);
            std::allocator<char>::~allocator(&local_331);
            pgVar1 = *(mapped_type *)(local_18 + 10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff2a0,
                       (char *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298),
                       in_stack_fffffffffffff290);
            ppgVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_fffffffffffff2a0,
                                    (key_type *)
                                    CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
            *ppgVar11 = pgVar1;
            std::__cxx11::string::~string(local_358);
            std::allocator<char>::~allocator(&local_359);
            pgVar1 = *(mapped_type *)(local_18 + 0xc);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff2a0,
                       (char *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298),
                       in_stack_fffffffffffff290);
            ppgVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_fffffffffffff2a0,
                                    (key_type *)
                                    CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
            *ppgVar11 = pgVar1;
            std::__cxx11::string::~string(local_380);
            std::allocator<char>::~allocator(&local_381);
            pgVar1 = *(mapped_type *)(local_18 + 0xe);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff2a0,
                       (char *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298),
                       in_stack_fffffffffffff290);
            ppgVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_fffffffffffff2a0,
                                    (key_type *)
                                    CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
            *ppgVar11 = pgVar1;
            std::__cxx11::string::~string(local_3a8);
            std::allocator<char>::~allocator(&local_3a9);
            pgVar1 = *(mapped_type *)(local_18 + 0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff2a0,
                       (char *)CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298),
                       in_stack_fffffffffffff290);
            ppgVar11 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                     *)in_stack_fffffffffffff2a0,
                                    (key_type *)
                                    CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298));
            *ppgVar11 = pgVar1;
            std::__cxx11::string::~string(local_3d0);
            std::allocator<char>::~allocator(&local_3d1);
            for (local_3d8 = 0; local_3d8 < (int)local_308; local_3d8 = local_3d8 + 1) {
              local_3e0 = std::vector<gpt2_layer,_std::allocator<gpt2_layer>_>::operator[]
                                    ((vector<gpt2_layer,_std::allocator<gpt2_layer>_> *)
                                     (local_18 + 0x12),(long)local_3d8);
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
              local_3e0->ln_1_g = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
              local_3e0->ln_1_b = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
              local_3e0->ln_2_g = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
              local_3e0->ln_2_b = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a0,local_298,(long)(int)local_304,
                                           (long)(int)(local_304 * 3));
              local_3e0->c_attn_attn_w = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)(local_304 * 3));
              local_3e0->c_attn_attn_b = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a0,local_298,(long)(int)local_304);
              local_3e0->c_attn_proj_w = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
              local_3e0->c_attn_proj_b = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a0,local_298,(long)(int)local_304,
                                           (long)(int)(local_304 << 2));
              local_3e0->c_mlp_fc_w = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)(local_304 << 2));
              local_3e0->c_mlp_fc_b = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_2d(*(undefined8 *)local_2a0,local_298,
                                           (long)(int)(local_304 << 2));
              local_3e0->c_mlp_proj_w = pgVar12;
              pgVar12 = (ggml_tensor *)
                        ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)(int)local_304);
              local_3e0->c_mlp_proj_b = pgVar12;
              pgVar12 = local_3e0->ln_1_g;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_400);
              std::__cxx11::string::~string(local_420);
              std::__cxx11::string::~string(local_440);
              pgVar12 = local_3e0->ln_1_b;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_460);
              std::__cxx11::string::~string(local_480);
              std::__cxx11::string::~string(local_4a0);
              pgVar12 = local_3e0->ln_2_g;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_4c0);
              std::__cxx11::string::~string(local_4e0);
              std::__cxx11::string::~string(local_500);
              pgVar12 = local_3e0->ln_2_b;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_520);
              std::__cxx11::string::~string(local_540);
              std::__cxx11::string::~string(local_560);
              pgVar12 = local_3e0->c_attn_attn_w;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_580);
              std::__cxx11::string::~string(local_5a0);
              std::__cxx11::string::~string(local_5c0);
              pgVar12 = local_3e0->c_attn_attn_b;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_5e0);
              std::__cxx11::string::~string(local_600);
              std::__cxx11::string::~string(local_620);
              pgVar12 = local_3e0->c_attn_proj_w;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_640);
              std::__cxx11::string::~string(local_660);
              std::__cxx11::string::~string(local_680);
              pgVar12 = local_3e0->c_attn_proj_b;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_6a0);
              std::__cxx11::string::~string(local_6c0);
              std::__cxx11::string::~string(local_6e0);
              pgVar12 = local_3e0->c_mlp_fc_w;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_700);
              std::__cxx11::string::~string(local_720);
              std::__cxx11::string::~string(local_740);
              pgVar12 = local_3e0->c_mlp_fc_b;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_760);
              std::__cxx11::string::~string(local_780);
              std::__cxx11::string::~string(local_7a0);
              pgVar12 = local_3e0->c_mlp_proj_w;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_7c0);
              std::__cxx11::string::~string(local_7e0);
              std::__cxx11::string::~string(local_800);
              pgVar12 = local_3e0->c_mlp_proj_b;
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff2a8 >> 0x20));
              std::operator+((char *)__lhs_00,__lhs);
              std::operator+(__lhs_00,(char *)__lhs);
              ppgVar11 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                       *)in_stack_fffffffffffff2a0,
                                      (key_type *)
                                      CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298))
              ;
              *ppgVar11 = pgVar12;
              std::__cxx11::string::~string(local_820);
              std::__cxx11::string::~string(local_840);
              std::__cxx11::string::~string(local_860);
            }
            local_868 = local_18;
            local_86c = local_18[2];
            local_870 = local_18[4];
            local_874 = local_18[1];
            local_878 = local_870 * local_874;
            local_87c = local_86c * local_878;
            uVar6 = ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)local_87c);
            *(undefined8 *)(local_18 + 0x18) = uVar6;
            uVar6 = ggml_new_tensor_1d(*(undefined8 *)local_2a0,0,(long)local_87c);
            *(undefined8 *)(local_18 + 0x1a) = uVar6;
            lVar9 = ggml_nbytes(*(undefined8 *)(local_18 + 0x18));
            local_888 = ggml_nbytes(*(undefined8 *)(local_18 + 0x1a));
            local_888 = lVar9 + local_888;
            auVar17._8_4_ = (int)((ulong)local_888 >> 0x20);
            auVar17._0_8_ = local_888;
            auVar17._12_4_ = 0x45300000;
            printf("%s: memory size = %8.2f MB, n_mem = %d\n",
                   ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_888) - 4503599627370496.0)) *
                   0.0009765625 * 0.0009765625,"gpt2_model_load",(ulong)local_878);
            local_890 = (allocator_type *)0x0;
            local_891 = 0;
            do {
              std::istream::read((char *)local_228,(long)&local_898);
              std::istream::read((char *)local_228,(long)local_89c);
              std::istream::read((char *)local_228,(long)(local_8ac + 3));
              bVar3 = std::ios::eof();
              if ((bVar3 & 1) != 0) {
                auVar18._8_4_ = (int)((ulong)local_890 >> 0x20);
                auVar18._0_8_ = local_890;
                auVar18._12_4_ = 0x45300000;
                printf("%s: model size  = %8.2f MB\n",
                       ((auVar18._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_890) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,"gpt2_model_load");
                std::ifstream::close();
                local_1 = 1;
                local_238 = 1;
                break;
              }
              local_8ac[2] = 1;
              local_8ac[0] = 1;
              local_8ac[1] = 1;
              for (local_8b0 = 0; local_8b0 < local_898; local_8b0 = local_8b0 + 1) {
                std::istream::read((char *)local_228,(long)(local_8ac + local_8b0));
                local_8ac[2] = local_8ac[local_8b0] * local_8ac[2];
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff280,
                         CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                         (char)((ulong)in_stack_fffffffffffff270 >> 0x38),
                         (allocator<char> *)__lhs_00);
              std::allocator<char>::~allocator(&local_8d1);
              lVar9 = std::__cxx11::string::operator[]((ulong)local_8d0);
              std::istream::read((char *)local_228,lVar9);
              local_8e0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::find(this_00,(key_type *)0x112c38);
              local_8e8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                   ::end(this_00);
              bVar4 = std::operator==(&local_8e0,&local_8e8);
              pFVar2 = _stderr;
              if (bVar4) {
                uVar6 = std::__cxx11::string::c_str();
                fprintf(pFVar2,"%s: unknown tensor \'%s\' in model file\n","gpt2_model_load",uVar6);
                local_1 = 0;
                local_238 = 1;
              }
              else {
                ppgVar11 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                                         *)in_stack_fffffffffffff2a0,
                                        (key_type *)
                                        CONCAT17(in_stack_fffffffffffff29f,in_stack_fffffffffffff298
                                                ));
                pgVar1 = *ppgVar11;
                lVar9 = ggml_nelements(pgVar1);
                pFVar2 = _stderr;
                if (lVar9 == local_8ac[2]) {
                  if ((pgVar1->ne[0] == (long)local_8ac[0]) && (pgVar1->ne[1] == (long)local_8ac[1])
                     ) {
                    lVar9 = ggml_type_size(local_8ac[3]);
                    lVar10 = (long)local_8ac[2];
                    uVar13 = ggml_blck_size(pgVar1->type);
                    uVar14 = ggml_nbytes(pgVar1);
                    pFVar2 = _stderr;
                    if ((ulong)(lVar10 * lVar9) / uVar13 == uVar14) {
                      in_stack_fffffffffffff2a0 =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pgVar1->data;
                      ggml_nbytes();
                      std::istream::read((char *)local_228,(long)in_stack_fffffffffffff2a0);
                      in_stack_fffffffffffff29f = std::operator==(__lhs,(char *)this_00);
                      if (((bool)in_stack_fffffffffffff29f) && ((local_891 & 1) == 0)) {
                        in_stack_fffffffffffff280 =
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (*(long *)(local_18 + 0x10) + 0xf8);
                        __src = pgVar1->data;
                        __n = ggml_nbytes();
                        memcpy(in_stack_fffffffffffff280,__src,__n);
                      }
                      in_stack_fffffffffffff27f = std::operator==(__lhs,(char *)this_00);
                      if ((bool)in_stack_fffffffffffff27f) {
                        local_891 = 1;
                      }
                      in_stack_fffffffffffff270 = (allocator_type *)ggml_nbytes(pgVar1);
                      local_890 = in_stack_fffffffffffff270 + (long)local_890;
                      local_238 = 0;
                    }
                    else {
                      uVar6 = std::__cxx11::string::c_str();
                      uVar15 = ggml_nbytes(pgVar1);
                      fprintf(pFVar2,
                              "%s: tensor \'%s\' has wrong size in model file: got %zu, expected %zu\n"
                              ,"gpt2_model_load",uVar6,uVar15,local_8ac[2] * lVar9);
                      local_1 = 0;
                      local_238 = 1;
                    }
                  }
                  else {
                    uVar6 = std::__cxx11::string::c_str();
                    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
                               *)CONCAT44((int)((ulong)this_00 >> 0x20),local_8ac[0]);
                    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44((int)((ulong)__lhs >> 0x20),local_8ac[1]);
                    fprintf(pFVar2,
                            "%s: tensor \'%s\' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n"
                            ,"gpt2_model_load",uVar6,pgVar1->ne[0] & 0xffffffff,
                            pgVar1->ne[1] & 0xffffffff);
                    local_1 = 0;
                    local_238 = 1;
                  }
                }
                else {
                  uVar6 = std::__cxx11::string::c_str();
                  fprintf(pFVar2,"%s: tensor \'%s\' has wrong size in model file\n",
                          "gpt2_model_load",uVar6);
                  local_1 = 0;
                  local_238 = 1;
                }
              }
              std::__cxx11::string::~string(local_8d0);
            } while (local_238 == 0);
          }
        }
      }
      else {
        uVar6 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"%s: invalid model file \'%s\' (bad vocab size %d != %d)\n","gpt2_model_load"
                ,uVar6,(ulong)local_250,(ulong)*local_18);
        local_1 = 0;
        local_238 = 1;
      }
    }
    else {
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar2,"%s: invalid model file \'%s\' (bad magic)\n","gpt2_model_load",uVar6);
      local_1 = 0;
      local_238 = 1;
    }
  }
  else {
    uVar6 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"%s: failed to open \'%s\'\n","gpt2_model_load",uVar6);
    local_1 = 0;
    local_238 = 1;
  }
  std::ifstream::~ifstream(local_228);
  return (bool)(local_1 & 1);
}

Assistant:

bool gpt2_model_load(const std::string & fname, gpt2_model & model, gpt_vocab & vocab) {
    printf("%s: loading model from '%s'\n", __func__, fname.c_str());

    auto fin = std::ifstream(fname, std::ios::binary);
    if (!fin) {
        fprintf(stderr, "%s: failed to open '%s'\n", __func__, fname.c_str());
        return false;
    }

    // verify magic
    {
        uint32_t magic;
        fin.read((char *) &magic, sizeof(magic));
        if (magic != GGML_FILE_MAGIC) {
            fprintf(stderr, "%s: invalid model file '%s' (bad magic)\n", __func__, fname.c_str());
            return false;
        }
    }

    // load hparams
    {
        auto & hparams = model.hparams;

        fin.read((char *) &hparams.n_vocab, sizeof(hparams.n_vocab));
        fin.read((char *) &hparams.n_ctx,   sizeof(hparams.n_ctx));
        fin.read((char *) &hparams.n_embd,  sizeof(hparams.n_embd));
        fin.read((char *) &hparams.n_head,  sizeof(hparams.n_head));
        fin.read((char *) &hparams.n_layer, sizeof(hparams.n_layer));
        fin.read((char *) &hparams.ftype,   sizeof(hparams.ftype));

        const int32_t qntvr = hparams.ftype / GGML_QNT_VERSION_FACTOR;

        printf("%s: n_vocab = %d\n", __func__, hparams.n_vocab);
        printf("%s: n_ctx   = %d\n", __func__, hparams.n_ctx);
        printf("%s: n_embd  = %d\n", __func__, hparams.n_embd);
        printf("%s: n_head  = %d\n", __func__, hparams.n_head);
        printf("%s: n_layer = %d\n", __func__, hparams.n_layer);
        printf("%s: ftype   = %d\n", __func__, hparams.ftype);
        printf("%s: qntvr   = %d\n", __func__, qntvr);

        hparams.ftype %= GGML_QNT_VERSION_FACTOR;
    }

    // load vocab
    {
        int32_t n_vocab = 0;
        fin.read((char *) &n_vocab, sizeof(n_vocab));

        if (n_vocab != model.hparams.n_vocab) {
            fprintf(stderr, "%s: invalid model file '%s' (bad vocab size %d != %d)\n",
                    __func__, fname.c_str(), n_vocab, model.hparams.n_vocab);
            return false;
        }

        std::string word;
        std::vector<char> buf(128);

        for (int i = 0; i < n_vocab; i++) {
            uint32_t len;
            fin.read((char *) &len, sizeof(len));

            buf.resize(len);
            fin.read((char *) buf.data(), len);
            word.assign(buf.data(), len);

            vocab.token_to_id[word] = i;
            vocab.id_to_token[i] = word;
        }
    }

    // for the big tensors, we have the option to store the data in 16-bit floats or quantized
    // in order to save memory and also to speed up the computation
    ggml_type wtype = ggml_ftype_to_ggml_type((ggml_ftype) (model.hparams.ftype));
    if (wtype == GGML_TYPE_COUNT) {
        fprintf(stderr, "%s: invalid model file '%s' (bad ftype value %d)\n",
                __func__, fname.c_str(), model.hparams.ftype);
        return false;
    }

    auto & ctx = model.ctx_w;

    size_t ctx_size = 0;

    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_g
        ctx_size += ggml_row_size(GGML_TYPE_F32, n_embd); // ln_f_b

        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // wte
        ctx_size += ggml_row_size(GGML_TYPE_F32,   n_ctx*n_embd); // wpe
        ctx_size += ggml_row_size(wtype,         n_vocab*n_embd); // lm_head

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_1_b

        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_g
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd)); // ln_2_b

        ctx_size += n_layer*(ggml_row_size(wtype,         3*n_embd*n_embd)); // c_attn_attn_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 3*n_embd));        // c_attn_attn_b

        ctx_size += n_layer*(ggml_row_size(wtype,         n_embd*n_embd));   // c_attn_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, n_embd));          // c_attn_proj_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_fc_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_fc_b

        ctx_size += n_layer*(ggml_row_size(wtype,         4*n_embd*n_embd)); // c_mlp_proj_w
        ctx_size += n_layer*(ggml_row_size(GGML_TYPE_F32, 4*n_embd));        // c_mlp_proj_b

        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_k
        ctx_size += n_ctx*n_layer*ggml_row_size(GGML_TYPE_F32, n_embd); // memory_v

        ctx_size += (6 + 12*n_layer)*512; // object overhead

        printf("%s: ggml tensor size = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
        printf("%s: ggml ctx size = %6.2f MB\n", __func__, ctx_size/(1024.0*1024.0));
    }

    // create the ggml context
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ ctx_size,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ false,
        };

        model.ctx_w = ggml_init(params);
        if (!model.ctx_w) {
            fprintf(stderr, "%s: ggml_init() failed\n", __func__);
            return false;
        }
    }

    // prepare memory for the weights
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;
        const int n_vocab = hparams.n_vocab;

        model.layers.resize(n_layer);

        model.ln_f_g = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);
        model.ln_f_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_embd);

        model.wte     = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);
        model.wpe     = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, n_embd, n_ctx);
        model.lm_head = ggml_new_tensor_2d(ctx, wtype,         n_embd, n_vocab);

        // map by name
        model.tensors["model/ln_f/g"] = model.ln_f_g;
        model.tensors["model/ln_f/b"] = model.ln_f_b;

        model.tensors["model/wte"]     = model.wte;
        model.tensors["model/wpe"]     = model.wpe;
        model.tensors["model/lm_head"] = model.lm_head;

        for (int i = 0; i < n_layer; ++i) {
            auto & layer = model.layers[i];

            layer.ln_1_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_1_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.ln_2_g        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);
            layer.ln_2_b        = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_attn_attn_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, 3*n_embd);
            layer.c_attn_attn_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 3*n_embd);

            layer.c_attn_proj_w = ggml_new_tensor_2d(ctx, wtype,           n_embd, n_embd);
            layer.c_attn_proj_b = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            layer.c_mlp_fc_w    = ggml_new_tensor_2d(ctx, wtype,           n_embd, 4*n_embd);
            layer.c_mlp_fc_b    = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4*n_embd);

            layer.c_mlp_proj_w  = ggml_new_tensor_2d(ctx, wtype,         4*n_embd, n_embd);
            layer.c_mlp_proj_b  = ggml_new_tensor_1d(ctx, GGML_TYPE_F32,   n_embd);

            // map by name
            model.tensors["model/h" + std::to_string(i) + "/ln_1/g"]        = layer.ln_1_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_1/b"]        = layer.ln_1_b;

            model.tensors["model/h" + std::to_string(i) + "/ln_2/g"]        = layer.ln_2_g;
            model.tensors["model/h" + std::to_string(i) + "/ln_2/b"]        = layer.ln_2_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/w"] = layer.c_attn_attn_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_attn/b"] = layer.c_attn_attn_b;

            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/w"] = layer.c_attn_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/attn/c_proj/b"] = layer.c_attn_proj_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/w"]    = layer.c_mlp_fc_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_fc/b"]    = layer.c_mlp_fc_b;

            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/w"]  = layer.c_mlp_proj_w;
            model.tensors["model/h" + std::to_string(i) + "/mlp/c_proj/b"]  = layer.c_mlp_proj_b;
        }
    }

    // key + value memory
    {
        const auto & hparams = model.hparams;

        const int n_embd  = hparams.n_embd;
        const int n_layer = hparams.n_layer;
        const int n_ctx   = hparams.n_ctx;

        const int n_mem      = n_layer*n_ctx;
        const int n_elements = n_embd*n_mem;

        model.memory_k = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);
        model.memory_v = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, n_elements);

        const size_t memory_size = ggml_nbytes(model.memory_k) + ggml_nbytes(model.memory_v);

        printf("%s: memory size = %8.2f MB, n_mem = %d\n", __func__, memory_size/1024.0/1024.0, n_mem);
    }

    // load weights
    {
        size_t total_size = 0;

        bool has_lm_head = false;

        while (true) {
            int32_t n_dims;
            int32_t length;
            int32_t ttype;

            fin.read(reinterpret_cast<char *>(&n_dims), sizeof(n_dims));
            fin.read(reinterpret_cast<char *>(&length), sizeof(length));
            fin.read(reinterpret_cast<char *>(&ttype),  sizeof(ttype));

            if (fin.eof()) {
                break;
            }

            int32_t nelements = 1;
            int32_t ne[2] = { 1, 1 };
            for (int i = 0; i < n_dims; ++i) {
                fin.read(reinterpret_cast<char *>(&ne[i]), sizeof(ne[i]));
                nelements *= ne[i];
            }

            std::string name(length, 0);
            fin.read(&name[0], length);

            if (model.tensors.find(name) == model.tensors.end()) {
                fprintf(stderr, "%s: unknown tensor '%s' in model file\n", __func__, name.c_str());
                return false;
            }

            auto tensor = model.tensors[name];
            if (ggml_nelements(tensor) != nelements) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file\n", __func__, name.c_str());
                return false;
            }

            if (tensor->ne[0] != ne[0] || tensor->ne[1] != ne[1]) {
                fprintf(stderr, "%s: tensor '%s' has wrong shape in model file: got [%d, %d], expected [%d, %d]\n",
                        __func__, name.c_str(), (int) tensor->ne[0], (int) tensor->ne[1], ne[0], ne[1]);
                return false;
            }

            // for debugging
            if (0) {
                printf("%24s - [%5d, %5d], type = %6s, %6.2f MB, %9zu bytes\n", name.c_str(), ne[0], ne[1], ggml_type_name(ggml_type(ttype)), ggml_nbytes(tensor)/1024.0/1024.0, ggml_nbytes(tensor));
            }

            const size_t bpe = ggml_type_size(ggml_type(ttype));

            if ((nelements*bpe)/ggml_blck_size(tensor->type) != ggml_nbytes(tensor)) {
                fprintf(stderr, "%s: tensor '%s' has wrong size in model file: got %zu, expected %zu\n",
                        __func__, name.c_str(), ggml_nbytes(tensor), nelements*bpe);
                return false;
            }

            fin.read(reinterpret_cast<char *>(tensor->data), ggml_nbytes(tensor));

            // GPT-2 models share the WTE tensor as the LM head
            if (name == "model/wte" && has_lm_head == false) {
                memcpy(model.lm_head->data, tensor->data, ggml_nbytes(tensor));
            }

            if (name == "model/lm_head") {
                has_lm_head = true;
            }

            total_size += ggml_nbytes(tensor);
        }

        printf("%s: model size  = %8.2f MB\n", __func__, total_size/1024.0/1024.0);
    }

    fin.close();

    return true;
}